

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_property.c
# Opt level: O2

int mpt_world_set(mpt_world *wld,char *name,mpt_convertable *src)

{
  mpt_color *pmVar1;
  int iVar2;
  uint uVar3;
  mpt_lineattr *pmVar4;
  mpt_world *from;
  
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      return -4;
    }
    iVar2 = mpt_world_pointer_typeid();
    if ((iVar2 < 1) || (iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,&from), iVar2 < 0)) {
      iVar2 = mpt_string_pset(&wld->_alias,src);
      if (-1 < iVar2) {
        return iVar2;
      }
      iVar2 = mpt_color_typeid();
      if (0 < iVar2) {
        pmVar1 = &wld->color;
        iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,pmVar1);
        if (-1 < iVar2) {
          if (iVar2 != 0) {
            return 0;
          }
          pmVar1->alpha = 0xff;
          pmVar1->red = '\0';
          pmVar1->green = '\0';
          pmVar1->blue = '\0';
          return 0;
        }
      }
      iVar2 = mpt_lattr_typeid();
      if (iVar2 < 1) {
        return -3;
      }
      pmVar4 = &wld->attr;
      iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,pmVar4);
      if (iVar2 < 0) {
        return -3;
      }
      if (iVar2 != 0) {
        return 0;
      }
      pmVar4->style = '\x01';
      pmVar4->width = '\x01';
      pmVar4->symbol = '\0';
      pmVar4->size = '\n';
      return 0;
    }
  }
  else {
    if (*name != '\0') {
      iVar2 = strcasecmp(name,"cyc");
      if ((iVar2 == 0) || (iVar2 = strcasecmp(name,"cycles"), iVar2 == 0)) {
        if ((src != (mpt_convertable *)0x0) &&
           (uVar3 = (*src->_vptr->convert)(src,0x75,&wld->cyc), uVar3 != 0)) {
          return (int)uVar3 >> 0x1f & uVar3;
        }
      }
      else {
        iVar2 = strcasecmp(name,"color");
        if ((iVar2 != 0) && (iVar2 = strcasecmp(name,"colour"), iVar2 != 0)) {
          iVar2 = strcasecmp(name,"alias");
          if (iVar2 == 0) {
            if (src == (mpt_convertable *)0x0) {
              mpt_string_set(&wld->_alias,(char *)0x0,0);
              return 0;
            }
            iVar2 = mpt_string_pset(&wld->_alias,src);
            return iVar2;
          }
          iVar2 = strcasecmp(name,"width");
          if (iVar2 == 0) {
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).width = '\x01';
              return 0;
            }
            iVar2 = mpt_lattr_width(&wld->attr,src);
            return iVar2;
          }
          iVar2 = strcasecmp(name,"style");
          if (iVar2 == 0) {
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).style = '\x01';
              return 0;
            }
            iVar2 = mpt_lattr_style(&wld->attr,src);
            return iVar2;
          }
          iVar2 = strcasecmp(name,"sym");
          if ((iVar2 != 0) && (iVar2 = strcasecmp(name,"symbol"), iVar2 != 0)) {
            iVar2 = strcasecmp(name,"size");
            if (iVar2 != 0) {
              return -1;
            }
            if (src == (mpt_convertable *)0x0) {
              (wld->attr).size = '\n';
              return 0;
            }
            iVar2 = mpt_lattr_size(&wld->attr,src);
            return iVar2;
          }
          if (src == (mpt_convertable *)0x0) {
            (wld->attr).symbol = '\0';
            return 0;
          }
          iVar2 = mpt_lattr_symbol(&wld->attr,src);
          return iVar2;
        }
        if (src != (mpt_convertable *)0x0) {
          iVar2 = mpt_color_pset(&wld->color,src);
          return iVar2;
        }
      }
      wld->cyc = 0;
      return 0;
    }
    if (src == (mpt_convertable *)0x0) {
      mpt_world_fini(wld);
      return 0;
    }
    iVar2 = mpt_world_pointer_typeid();
    if (iVar2 < 1) {
      return -3;
    }
    iVar2 = (*src->_vptr->convert)(src,(mpt_type_t)iVar2,&from);
    if (iVar2 < 0) {
      return -3;
    }
  }
  mpt_world_fini(wld);
  if (iVar2 == 0) {
    from = (mpt_world *)0x0;
  }
  mpt_world_init(wld,from);
  return 0;
}

Assistant:

extern int mpt_world_set(MPT_STRUCT(world) *wld, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	if (!name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		if ((len = mpt_string_pset(&wld->_alias, src)) >= 0) {
			return len;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->color)) >= 0) {
			if (!len) wld->color = def_world.color;
			return 0;
		}
		if ((type = mpt_lattr_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &wld->attr)) >= 0) {
			if (!len) wld->attr = def_world.attr;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(world) *from;
		int type;
		
		if (!src) {
			mpt_world_fini(wld);
			return 0;
		}
		if ((type = mpt_world_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_world_fini(wld);
			mpt_world_init(wld, len ? from : 0);
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcasecmp(name, "cyc") || !strcasecmp(name, "cycles")) {
		if (!src || !(len = src->_vptr->convert(src, 'u', &wld->cyc))) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "color") || !strcasecmp(name, "colour")) {
		if (!src) {
			wld->cyc = def_world.cyc;
			return 0;
		}
		return mpt_color_pset(&wld->color, src);
	}
	if (!strcasecmp(name, "alias")) {
		if (!src) {
			mpt_string_set(&wld->_alias, 0, 0);
			return 0;
		}
		return mpt_string_pset(&wld->_alias, src);
	}
	if (!strcasecmp(name, "width")) {
		if (!src) {
			wld->attr.width = def_world.attr.width;
			return 0;
		}
		return mpt_lattr_width(&wld->attr, src);
	}
	if (!strcasecmp(name, "style")) {
		if (!src) {
			wld->attr.style = def_world.attr.style;
			return 0;
		}
		return mpt_lattr_style(&wld->attr, src);
	}
	if (!strcasecmp(name, "sym") || !strcasecmp(name, "symbol")) {
		if (!src) {
			wld->attr.symbol = def_world.attr.symbol;
			return 0;
		}
		return mpt_lattr_symbol(&wld->attr, src);
	}
	if (!strcasecmp(name, "size")) {
		if (!src) {
			wld->attr.size = def_world.attr.size;
			return 0;
		}
		return mpt_lattr_size(&wld->attr, src);
	}
	return MPT_ERROR(BadArgument);
}